

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O1

Trick * Trick::unserialize(json *data)

{
  size_t *psVar1;
  int iVar2;
  bool bVar3;
  Trick *pTVar4;
  reference this;
  const_reference pvVar5;
  Card *pCVar6;
  _List_node_base *p_Var7;
  int ret;
  iterator __end1;
  iterator __begin1;
  int local_74;
  iterator local_70;
  iterator local_50;
  
  pTVar4 = (Trick *)operator_new(0x20);
  (pTVar4->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_serialize_abi_cxx11__0011da30
  ;
  (pTVar4->_cards).
  super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&pTVar4->_cards;
  (pTVar4->_cards).
  super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&pTVar4->_cards;
  (pTVar4->_cards).
  super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>._M_impl._M_node
  ._M_size = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_50,data);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_70,data);
  bVar3 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_50,&local_70);
  if (!bVar3) {
    do {
      this = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&local_50);
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this,1);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar5,&local_74);
      pCVar6 = Card::get(local_74);
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this,0);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar5,&local_74);
      iVar2 = local_74;
      p_Var7 = (_List_node_base *)operator_new(0x20);
      p_Var7[1]._M_next = (_List_node_base *)pCVar6;
      *(int *)&p_Var7[1]._M_prev = iVar2;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar1 = &(pTVar4->_cards).
                super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_50);
      bVar3 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_50,&local_70);
    } while (!bVar3);
  }
  return pTVar4;
}

Assistant:

Trick *Trick::unserialize(json data) {
    Trick *t = new Trick;

    for (const auto &c: data) {
        t->addCard(Card::get(c[1]), c[0]);
    }

    return t;
}